

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<unsigned_char> * kj::heapArray<unsigned_char>(ArrayPtr<const_unsigned_char> content)

{
  size_t in_RDX;
  Array<unsigned_char> *result;
  Array<unsigned_char> *in_RDI;
  ArrayBuilder<unsigned_char> builder;
  ArrayBuilder<unsigned_char> local_48;
  ArrayPtr<const_unsigned_char> local_28;
  
  local_48.ptr = _::HeapArrayDisposer::allocateUninitialized<unsigned_char>(in_RDX);
  local_48.endPtr = local_48.ptr + in_RDX;
  local_48.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_48.pos = local_48.ptr;
  ArrayBuilder<unsigned_char>::addAll<kj::ArrayPtr<unsigned_char_const>&>(&local_48,&local_28);
  in_RDI->ptr = local_48.ptr;
  in_RDI->size_ = (long)local_48.pos - (long)local_48.ptr;
  in_RDI->disposer = local_48.disposer;
  local_48.ptr = (uchar *)0x0;
  local_48.pos = (RemoveConst<unsigned_char> *)0x0;
  local_48.endPtr = (uchar *)0x0;
  ArrayBuilder<unsigned_char>::dispose(&local_48);
  return in_RDI;
}

Assistant:

Array<T> heapArray(ArrayPtr<const T> content) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(content.size());
  builder.addAll(content);
  return builder.finish();
}